

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix4f.cpp
# Opt level: O1

Matrix4f * Matrix4f::identity(void)

{
  Matrix4f *m;
  Matrix4f *in_RDI;
  
  in_RDI->m_elements[0] = 0.0;
  in_RDI->m_elements[1] = 0.0;
  in_RDI->m_elements[2] = 0.0;
  in_RDI->m_elements[3] = 0.0;
  in_RDI->m_elements[4] = 0.0;
  in_RDI->m_elements[5] = 0.0;
  in_RDI->m_elements[6] = 0.0;
  in_RDI->m_elements[7] = 0.0;
  in_RDI->m_elements[8] = 0.0;
  in_RDI->m_elements[9] = 0.0;
  in_RDI->m_elements[10] = 0.0;
  in_RDI->m_elements[0xb] = 0.0;
  in_RDI->m_elements[0xc] = 0.0;
  in_RDI->m_elements[0xd] = 0.0;
  in_RDI->m_elements[0xe] = 0.0;
  in_RDI->m_elements[0xf] = 0.0;
  in_RDI->m_elements[0] = 1.0;
  in_RDI->m_elements[5] = 1.0;
  in_RDI->m_elements[10] = 1.0;
  in_RDI->m_elements[0xf] = 1.0;
  return in_RDI;
}

Assistant:

Matrix4f Matrix4f::identity()
{
	Matrix4f m;
	
	m( 0, 0 ) = 1;
	m( 1, 1 ) = 1;
	m( 2, 2 ) = 1;
	m( 3, 3 ) = 1;

	return m;
}